

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

size_t __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
Count(IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
      *this)

{
  function<bool_(const_int_&)> *pfVar1;
  map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  bool bVar2;
  size_t sVar3;
  iterator __end0;
  iterator __begin0;
  iterator local_1d0;
  iterator local_150;
  OUT local_d0;
  iterator local_b0;
  
  begin(&local_b0,this);
  end(&local_150,this);
  pfVar1 = &local_1d0.source.transformer;
  this_00 = &local_1d0.source.result;
  sVar3 = 0;
  while( true ) {
    local_1d0.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
         (_func_int **)&PTR_Init_001585e0;
    local_1d0.source.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88
    ;
    local_1d0.source.source.source.state.
    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_150.source.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1d0.source.source.source.state.
    super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_150.source.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_150.source.source.source.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150.source.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_150.source.source.source.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150.source.source.source.state.
         super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_150.source.source.source.state.
                        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::function<bool_(const_int_&)>::function(pfVar1,&local_150.source.transformer);
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::_Rb_tree(&this_00->_M_t,&local_150.source.result._M_t);
    local_1d0.source.current._M_node = local_150.source.current._M_node;
    local_1d0.valid = local_150.valid;
    bVar2 = iterator::operator!=(&local_b0,&local_1d0);
    local_1d0.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
         (_func_int **)&PTR_Init_001585e0;
    std::
    _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&this_00->_M_t);
    if (local_1d0.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_1d0.source.transformer.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    local_1d0.source.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88
    ;
    if (local_1d0.source.source.source.state.
        super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d0.source.source.source.state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                );
    }
    if (!bVar2) break;
    GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Current
              (&local_d0,&local_b0.source);
    local_d0.super_IEnumerable<int_&>.super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00158638;
    if (local_d0.super_IEnumerable<int_&>.state.
        super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.super_IEnumerable<int_&>.state.
                 super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_b0.source.current._M_node =
         (_Base_ptr)std::_Rb_tree_increment(local_b0.source.current._M_node);
    local_b0.valid =
         local_b0.source.current._M_node !=
         &local_b0.source.result._M_t._M_impl.super__Rb_tree_header._M_header;
    sVar3 = sVar3 + 1;
  }
  local_150.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_001585e0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_150.source.result._M_t);
  if (local_150.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_150.source.transformer;
    (*local_150.source.transformer.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  local_150.source.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_150.source.source.source.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.source.source.source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_b0.source.super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_001585e0;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_b0.source.result._M_t);
  if (local_b0.source.transformer.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &local_b0.source.transformer;
    (*local_b0.source.transformer.super__Function_base._M_manager)
              ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  local_b0.source.source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  if (local_b0.source.source.source.state.
      super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.source.source.source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return sVar3;
}

Assistant:

size_t Count() 
		{
			size_t count = 0; 
			
			for(const auto& _ : *this) 
				count++; 
			
			return count;
		}